

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationBuilder::addIfDifferent
          (CollationBuilder *this,UnicodeString *prefix,UnicodeString *str,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t ces2Length;
  int64_t aiStack_128 [31];
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    ces2Length = CollationDataBuilder::getCEs(this->dataBuilder,prefix,str,aiStack_128,0);
    UVar1 = sameCEs(newCEs,newCEsLength,aiStack_128,ces2Length);
    if (UVar1 == '\0') {
      if (ce32 == 0xffffffff) {
        ce32 = (*(this->dataBuilder->super_UObject)._vptr_UObject[4])
                         (this->dataBuilder,newCEs,newCEsLength,errorCode);
      }
      CollationDataBuilder::addCE32(this->dataBuilder,prefix,str,ce32,errorCode);
    }
  }
  return ce32;
}

Assistant:

uint32_t
CollationBuilder::addIfDifferent(const UnicodeString &prefix, const UnicodeString &str,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }
    int64_t oldCEs[Collation::MAX_EXPANSION_LENGTH];
    int32_t oldCEsLength = dataBuilder->getCEs(prefix, str, oldCEs, 0);
    if(!sameCEs(newCEs, newCEsLength, oldCEs, oldCEsLength)) {
        if(ce32 == Collation::UNASSIGNED_CE32) {
            ce32 = dataBuilder->encodeCEs(newCEs, newCEsLength, errorCode);
        }
        dataBuilder->addCE32(prefix, str, ce32, errorCode);
    }
    return ce32;
}